

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::MergeUsingImpl
          (Parser *this,ZeroCopyInputStream *param_1,Message *output,ParserImpl *parser_impl)

{
  bool bVar1;
  char *in_R8;
  string_view separator;
  string_view message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missing_fields;
  string local_c0;
  undefined1 local_a0 [32];
  AlphaNum local_80;
  size_type local_50;
  pointer local_48;
  
  bVar1 = ParserImpl::Parse(parser_impl,output);
  if (bVar1) {
    if (this->allow_partial_ != false) {
      return true;
    }
    bVar1 = MessageLite::IsInitialized(&output->super_MessageLite);
    if (bVar1) {
      return true;
    }
    missing_fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    missing_fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    missing_fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Message::FindInitializationErrors(output,&missing_fields);
    local_80.piece_ = absl::lts_20240722::NullSafeStringView("Message missing required fields: ");
    separator._M_str = in_R8;
    separator._M_len = (size_t)", ";
    absl::lts_20240722::strings_internal::
    JoinRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_c0,(strings_internal *)&missing_fields,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x2,separator);
    local_50 = local_c0._M_string_length;
    local_48 = local_c0._M_dataplus._M_p;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_a0,&local_80);
    message._M_str = (char *)local_a0._0_8_;
    message._M_len = local_a0._8_8_;
    ParserImpl::ReportError(parser_impl,-1,0,message);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&missing_fields);
  }
  return false;
}

Assistant:

bool TextFormat::Parser::MergeUsingImpl(io::ZeroCopyInputStream* /* input */,
                                        Message* output,
                                        ParserImpl* parser_impl) {
  if (!parser_impl->Parse(output)) return false;
  if (!allow_partial_ && !output->IsInitialized()) {
    std::vector<std::string> missing_fields;
    output->FindInitializationErrors(&missing_fields);
    parser_impl->ReportError(-1, 0,
                             absl::StrCat("Message missing required fields: ",
                                          absl::StrJoin(missing_fields, ", ")));
    return false;
  }
  return true;
}